

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int create_code(archive_read *a,huffman_code *code,uchar *lengths,int numsymbols,char maxlength)

{
  int iVar1;
  uint uVar2;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  archive *in_RDI;
  char in_R8B;
  int symbolsleft;
  int codebits;
  int j;
  int i;
  int local_30;
  uint local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar2 = in_ECX;
  iVar1 = new_node((huffman_code *)(ulong)in_ECX);
  if (iVar1 < 0) {
    archive_set_error(in_RDI,0xc,"Unable to allocate memory for node data.");
    iVar1 = -0x1e;
  }
  else {
    *(undefined4 *)(in_RSI + 8) = 1;
    *(undefined4 *)(in_RSI + 0xc) = 0x7fffffff;
    *(undefined4 *)(in_RSI + 0x10) = 0x80000000;
    for (local_2c = 1; (int)local_2c <= (int)in_R8B; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < (int)in_ECX; local_30 = local_30 + 1) {
        if (*(byte *)(in_RDX + local_30) == local_2c) {
          iVar1 = add_value((archive_read *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            (huffman_code *)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                            (int)((ulong)in_RDX >> 0x20));
          if (iVar1 != 0) {
            return -0x1e;
          }
          uVar2 = uVar2 - 1;
          if ((int)uVar2 < 1) break;
        }
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
create_code(struct archive_read *a, struct huffman_code *code,
            unsigned char *lengths, int numsymbols, char maxlength)
{
  int i, j, codebits = 0, symbolsleft = numsymbols;

  if (new_node(code) < 0) {
    archive_set_error(&a->archive, ENOMEM,
                      "Unable to allocate memory for node data.");
    return (ARCHIVE_FATAL);
  }
  code->numentries = 1;
  code->minlength = INT_MAX;
  code->maxlength = INT_MIN;
  codebits = 0;
  for(i = 1; i <= maxlength; i++)
  {
    for(j = 0; j < numsymbols; j++)
    {
      if (lengths[j] != i) continue;
      if (add_value(a, code, j, codebits, i) != ARCHIVE_OK)
        return (ARCHIVE_FATAL);
      codebits++;
      if (--symbolsleft <= 0) { break; break; }
    }
    codebits <<= 1;
  }
  return (ARCHIVE_OK);
}